

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Reader * __thiscall Reader::compile(Reader *this)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  Command *this_00;
  vector<int,_std::allocator<int>_> *__x;
  Command local_1a8;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string name;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string current;
  Ant *ant;
  iterator __end2;
  iterator __begin2;
  vector<Ant,_std::allocator<Ant>_> *__range2;
  Reader *this_local;
  
  do {
    __end2 = std::vector<Ant,_std::allocator<Ant>_>::begin(&this->nts);
    ant = (Ant *)std::vector<Ant,_std::allocator<Ant>_>::end(&this->nts);
    while (bVar3 = __gnu_cxx::operator==<Ant_*,_std::vector<Ant,_std::allocator<Ant>_>_>
                             (&__end2,(__normal_iterator<Ant_*,_std::vector<Ant,_std::allocator<Ant>_>_>
                                       *)&ant), ((bVar3 ^ 0xffU) & 1) != 0) {
      current.field_2._8_8_ =
           __gnu_cxx::__normal_iterator<Ant_*,_std::vector<Ant,_std::allocator<Ant>_>_>::operator*
                     (&__end2);
      Ant::step((Ant *)current.field_2._8_8_,&this->wls,&this->phrs,&this->gts);
      if (*(int *)(current.field_2._8_8_ + 8) < 0) {
        return this;
      }
      iVar2 = *(int *)(current.field_2._8_8_ + 8);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->lns);
      if (sVar4 <= (ulong)(long)iVar2) {
        return this;
      }
      if (*(int *)(current.field_2._8_8_ + 4) < 0) {
        return this;
      }
      iVar2 = *(int *)(current.field_2._8_8_ + 4);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->lns,(long)*(int *)(current.field_2._8_8_ + 8));
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (pvVar5);
      if (sVar6 <= (ulong)(long)iVar2) {
        return this;
      }
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->lns,(long)*(int *)(current.field_2._8_8_ + 8));
      pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (pvVar5,(long)*(int *)(current.field_2._8_8_ + 4));
      cVar1 = *pvVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,1,cVar1,&local_59);
      std::allocator<char>::~allocator(&local_59);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"q");
      if (bVar3) {
        bVar3 = true;
        this_local = this;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_58,"z");
        if (bVar3) {
          sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->stack);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->stack,sVar4 - 1);
          if (*pvVar8 == 0) {
            Ant::updatePh((Ant *)current.field_2._8_8_,&this->wls,&this->phrs,&this->gts);
          }
        }
        else {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     ((long)&name.field_2 + 8),"[A-Za-z]",0x10);
          bVar3 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_58,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                      ((long)&name.field_2 + 8),0);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     ((long)&name.field_2 + 8));
          if (bVar3) {
            std::__cxx11::string::string
                      ((string *)local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
            Ant::step((Ant *)current.field_2._8_8_,&this->wls,&this->phrs,&this->gts);
            iVar2 = *(int *)(current.field_2._8_8_ + 8);
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&this->lns);
            if ((0 < iVar2) < sVar4) {
              iVar2 = *(int *)(current.field_2._8_8_ + 4);
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&this->lns,(long)*(int *)(current.field_2._8_8_ + 8));
              sVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                (pvVar5);
              if (sVar6 <= (0 < iVar2)) goto LAB_001073d5;
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&this->lns,(long)*(int *)(current.field_2._8_8_ + 8));
              pvVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                                 (pvVar5,(long)*(int *)(current.field_2._8_8_ + 4));
              cVar1 = *pvVar7;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,1,cVar1,
                         (allocator<char> *)
                         ((long)&args.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58,&local_d0);
              std::__cxx11::string::~string((string *)&local_d0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&args.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&arg.field_2 + 8));
              std::__cxx11::string::string((string *)local_110);
              while (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_58,"`"), ((bVar3 ^ 0xffU) & 1) != 0) {
                Ant::step((Ant *)current.field_2._8_8_,&this->wls,&this->phrs,&this->gts);
                iVar2 = *(int *)(current.field_2._8_8_ + 8);
                sVar4 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&this->lns);
                if (sVar4 <= (0 < iVar2)) {
LAB_00107595:
                  bVar3 = true;
                  this_local = this;
                  goto LAB_00107839;
                }
                iVar2 = *(int *)(current.field_2._8_8_ + 4);
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&this->lns,(long)*(int *)(current.field_2._8_8_ + 8));
                sVar6 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  (pvVar5);
                if (sVar6 <= (0 < iVar2)) goto LAB_00107595;
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_58,";");
                if (bVar3) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&arg.field_2 + 8),(value_type *)local_110);
                  std::__cxx11::string::string((string *)&local_130);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_110,&local_130);
                  std::__cxx11::string::~string((string *)&local_130);
                }
                else {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58);
                }
                iVar2 = *(int *)(current.field_2._8_8_ + 8);
                sVar4 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&this->lns);
                if (sVar4 <= (0 < iVar2)) {
LAB_001076d2:
                  bVar3 = true;
                  this_local = this;
                  goto LAB_00107839;
                }
                iVar2 = *(int *)(current.field_2._8_8_ + 4);
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&this->lns,(long)*(int *)(current.field_2._8_8_ + 8));
                sVar6 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  (pvVar5);
                if (sVar6 <= (0 < iVar2)) goto LAB_001076d2;
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&this->lns,(long)*(int *)(current.field_2._8_8_ + 8));
                pvVar7 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                                   (pvVar5,(long)*(int *)(current.field_2._8_8_ + 4));
                cVar1 = *pvVar7;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_150,1,cVar1,&local_151);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,&local_150);
                std::__cxx11::string::~string((string *)&local_150);
                std::allocator<char>::~allocator(&local_151);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&arg.field_2 + 8),(value_type *)local_110);
              Command::Command(&local_1a8,(string *)local_b0,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&arg.field_2 + 8),&this->stack);
              this_00 = Command::execute(&local_1a8);
              __x = Command::getStack(this_00);
              std::vector<int,_std::allocator<int>_>::operator=(&this->stack,__x);
              Command::~Command(&local_1a8);
              bVar3 = false;
LAB_00107839:
              std::__cxx11::string::~string((string *)local_110);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&arg.field_2 + 8));
            }
            else {
LAB_001073d5:
              bVar3 = true;
              this_local = this;
            }
            std::__cxx11::string::~string((string *)local_b0);
            if (bVar3) goto LAB_001078b1;
          }
        }
        bVar3 = false;
      }
LAB_001078b1:
      std::__cxx11::string::~string((string *)local_58);
      if (bVar3) {
        return this_local;
      }
      __gnu_cxx::__normal_iterator<Ant_*,_std::vector<Ant,_std::allocator<Ant>_>_>::operator++
                (&__end2);
    }
  } while( true );
}

Assistant:

Reader& compile() {
            while (true) {
                for (Ant & ant : nts) {
                    ant.step(wls, phrs, gts);
                    if (0 > ant.y || ant.y >= lns.size() || 0 > ant.x || ant.x >= lns[ant.y].size())
                        return *this;
                    string current(1, lns[ant.y].at(ant.x));
                    if (current == "q") return *this;
                    else if (current == "z") {
                        if (stack[stack.size() - 1] == 0) { ant.updatePh(wls, phrs, gts); }
                    }
                    else if (regex_match(current, regex("[A-Za-z]"))) {
                        string name = current;
                        ant.step(wls, phrs, gts);
                        if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                            return *this;
                        current = string(1, lns[ant.y].at(ant.x));
                        vector<string> args;
                        string arg;
                        while (current != "`") {
                            ant.step(wls, phrs, gts);
                            if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                                return *this;
                            if (current == ";") {
                                args.push_back(arg);
                                arg = string();
                            } else
                                arg.append(current);
                            if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                                return *this;
                            current = string(1, lns[ant.y].at(ant.x));
                        } args.push_back(arg);
                        stack = Command(name, args, stack).execute().getStack();
                    }
                }
            }
        }